

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid_Iterator_Face.cpp
# Opt level: O3

void __thiscall
Nova::Grid_Iterator_Face<float,_1>::Reset_Axis(Grid_Iterator_Face<float,_1> *this,int axis_input)

{
  Range<int,_1> RVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  
  this->axis = axis_input;
  (this->super_Grid_Iterator<float,_1>).number_of_regions = 0;
  if (Interior_Region < this->region_type) {
LAB_0011e66a:
    __assert_fail("(region_type==Grid<T,d>::Interior_Region) && !side",
                  "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Face.cpp"
                  ,99,
                  "void Nova::Grid_Iterator_Face<float, 1>::Reset_Axis(const int) [T = float, d = 1]"
                 );
  }
  iVar6 = this->number_of_ghost_cells;
  iVar3 = 1 - iVar6;
  iVar2 = (((this->super_Grid_Iterator<float,_1>).grid)->counts)._data._M_elems[0] + iVar6;
  switch(this->region_type) {
  case Whole_Region:
    if (this->side != 0) {
      __assert_fail("!side",
                    "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Face.cpp"
                    ,0x31,
                    "void Nova::Grid_Iterator_Face<float, 1>::Reset_Axis(const int) [T = float, d = 1]"
                   );
    }
    if (axis_input != 0) goto LAB_0011e654;
    iVar2 = iVar2 + 1;
    break;
  case Ghost_Region:
    uVar5 = this->side;
    if (uVar5 == 0) {
      if (axis_input != 0) goto LAB_0011e654;
      if (0 < iVar6) {
        (this->super_Grid_Iterator<float,_1>).number_of_regions = 1;
        (this->super_Grid_Iterator<float,_1>).regions[0].min_corner._data._M_elems[0] = iVar3;
        (this->super_Grid_Iterator<float,_1>).regions[0].max_corner._data._M_elems[0] = 0;
      }
      uVar5 = (uint)(0 < iVar6);
      iVar3 = (iVar2 + 1) - iVar6;
      if (iVar3 <= iVar2) {
        (this->super_Grid_Iterator<float,_1>).number_of_regions = uVar5 + 1;
        (this->super_Grid_Iterator<float,_1>).regions[uVar5].min_corner._data._M_elems[0] =
             iVar3 + 1;
        (this->super_Grid_Iterator<float,_1>).regions[uVar5].max_corner._data._M_elems[0] =
             iVar2 + 1;
        goto LAB_0011e63c;
      }
      (this->super_Grid_Iterator<float,_1>).valid = 0 < iVar6;
      if (iVar6 < 1) {
        return;
      }
      goto LAB_0011e640;
    }
    iVar8 = (int)((uVar5 - ((int)(uVar5 + 1) >> 0x1f)) + 1) >> 1;
    if ((uVar5 & 1) == 0) {
      if (axis_input != 0) goto LAB_0011e654;
      if (iVar8 != 1) {
LAB_0011e6a8:
        lVar7 = (long)(iVar8 + -1);
        goto LAB_0011e657;
      }
      iVar6 = (iVar2 + 1) - iVar6;
      if (iVar6 <= iVar2) {
        (this->super_Grid_Iterator<float,_1>).number_of_regions = 1;
        (this->super_Grid_Iterator<float,_1>).regions[0].min_corner._data._M_elems[0] = iVar6 + 1;
        (this->super_Grid_Iterator<float,_1>).regions[0].max_corner._data._M_elems[0] = iVar2 + 1;
        goto LAB_0011e63c;
      }
    }
    else {
      if (axis_input != 0) goto LAB_0011e654;
      if (iVar8 != 1) goto LAB_0011e6a8;
      if (0 < iVar6) {
        (this->super_Grid_Iterator<float,_1>).number_of_regions = 1;
        (this->super_Grid_Iterator<float,_1>).regions[0].min_corner._data._M_elems[0] = iVar3;
        (this->super_Grid_Iterator<float,_1>).regions[0].max_corner._data._M_elems[0] = 0;
        goto LAB_0011e63c;
      }
    }
    goto LAB_0011e518;
  case Boundary_Region:
    uVar5 = this->side;
    if (uVar5 == 0 || (uVar5 & 1) != 0) {
      if (axis_input == 0) {
        (this->super_Grid_Iterator<float,_1>).number_of_regions = 1;
        (this->super_Grid_Iterator<float,_1>).regions[0].min_corner._data._M_elems[0] = iVar3;
        (this->super_Grid_Iterator<float,_1>).regions[0].max_corner._data._M_elems[0] = iVar3;
        uVar4 = 1;
        if ((uVar5 & 1) != 0) goto LAB_0011e63c;
        goto LAB_0011e5ae;
      }
LAB_0011e654:
      lVar7 = (long)axis_input;
LAB_0011e657:
      std::__throw_out_of_range_fmt("array::at: __n (which is %zu) >= _Nm (which is %zu)",lVar7,1);
    }
    uVar4 = 0;
    if (axis_input != 0) goto LAB_0011e654;
LAB_0011e5ae:
    (this->super_Grid_Iterator<float,_1>).number_of_regions = uVar4 + 1;
    (this->super_Grid_Iterator<float,_1>).regions[uVar4].min_corner._data._M_elems[0] = iVar2 + 1;
    (this->super_Grid_Iterator<float,_1>).regions[uVar4].max_corner._data._M_elems[0] = iVar2 + 1;
    goto LAB_0011e63c;
  case Interior_Region:
    if (this->side != 0) goto LAB_0011e66a;
    if (axis_input != 0) goto LAB_0011e654;
    iVar3 = 2 - iVar6;
  }
  if (iVar2 < iVar3) {
LAB_0011e518:
    (this->super_Grid_Iterator<float,_1>).valid = false;
  }
  else {
    (this->super_Grid_Iterator<float,_1>).number_of_regions = 1;
    (this->super_Grid_Iterator<float,_1>).regions[0].min_corner._data._M_elems[0] = iVar3;
    (this->super_Grid_Iterator<float,_1>).regions[0].max_corner._data._M_elems[0] = iVar2;
LAB_0011e63c:
    (this->super_Grid_Iterator<float,_1>).valid = true;
LAB_0011e640:
    (this->super_Grid_Iterator<float,_1>).current_region = 0;
    RVar1 = (this->super_Grid_Iterator<float,_1>).regions[0];
    (this->super_Grid_Iterator<float,_1>).region = RVar1;
    (this->super_Grid_Iterator<float,_1>).index._data._M_elems[0] =
         (int)RVar1.min_corner._data._M_elems[0]._data;
  }
  return;
}

Assistant:

void Grid_Iterator_Face<T,d>::
Reset_Axis(const int axis_input)
{
    axis=axis_input;
    Reset_Regions();
    Range<int,d> domain(grid.Cell_Indices(number_of_ghost_cells));

    switch(region_type)
    {
        case Grid<T,d>::Whole_Region:       assert(!side);
                                            ++domain.max_corner(axis);
                                            Add_Region(domain);
                                            break;

        case Grid<T,d>::Ghost_Region:       if(!side)
                                            {
                                                for(int side_iterator=1;side_iterator<=2*d;++side_iterator){
                                                    int axis_of_side=(side_iterator+1)/2;
                                                    if(side_iterator&1){
                                                        Range<int,d> domain_copy(domain);
                                                        ++domain_copy.max_corner(axis);
                                                        domain_copy.max_corner(axis_of_side-1)=domain_copy.min_corner(axis_of_side-1)+number_of_ghost_cells-1;
                                                        Add_Region(domain_copy);}
                                                    if(!(side_iterator&1)){
                                                        Range<int,d> domain_copy(domain);
                                                        ++domain_copy.max_corner(axis);
                                                        domain_copy.min_corner(axis_of_side-1)=domain_copy.max_corner(axis_of_side-1)-number_of_ghost_cells+1;
                                                        Add_Region(domain_copy);}}
                                            }
                                            else
                                            {
                                                int axis_of_side=(side+1)/2;
                                                if(side&1){
                                                    Range<int,d> domain_copy(domain);
                                                    ++domain_copy.max_corner(axis);
                                                    domain_copy.max_corner(axis_of_side-1)=domain_copy.min_corner(axis_of_side-1)+number_of_ghost_cells-1;
                                                    Add_Region(domain_copy);}
                                                if(!(side&1)){
                                                    Range<int,d> domain_copy(domain);
                                                    ++domain_copy.max_corner(axis);
                                                    domain_copy.min_corner(axis_of_side-1)=domain_copy.max_corner(axis_of_side-1)-number_of_ghost_cells+1;
                                                    Add_Region(domain_copy);}
                                            }
                                            break;

        case Grid<T,d>::Boundary_Region:    if(!side || side&1)
                                            {
                                                Range<int,d> domain_copy(domain);
                                                domain_copy.max_corner(axis)=domain.min_corner(axis);
                                                Add_Region(domain_copy);
                                            }
                                            if(!side || !(side&1))
                                            {
                                                Range<int,d> domain_copy(domain);
                                                domain_copy.min_corner(axis)=domain_copy.max_corner(axis)=domain.max_corner(axis)+1;
                                                Add_Region(domain_copy);
                                            }
                                            break;

        default:                            assert((region_type==Grid<T,d>::Interior_Region) && !side);
                                            ++domain.min_corner(axis);
                                            Add_Region(domain);
                                            break;
    }
    Reset();
}